

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void Unserialize<ParamsStream<AutoFile&,TransactionSerParams>,28u,unsigned_char>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *is,
               prevector<28U,_unsigned_char,_unsigned_int,_int> *v)

{
  uint new_capacity;
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *__nbytes;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(v,0);
  uVar4 = ReadCompactSize<ParamsStream<AutoFile&,TransactionSerParams>>(is,true);
  uVar6 = (uint)uVar4;
  if (uVar6 != 0) {
    do {
      uVar7 = uVar6 - uVar5;
      if (4999999 < uVar7) {
        uVar7 = 5000000;
      }
      uVar2 = v->_size;
      uVar3 = 0x1c;
      if (0x1c < uVar2) {
        uVar3 = (v->_union).indirect_contents.capacity;
      }
      new_capacity = uVar7 + uVar5;
      if (uVar3 < new_capacity) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity(v,new_capacity);
        uVar2 = v->_size;
      }
      uVar3 = uVar2 - 0x1d;
      if (uVar2 < 0x1d) {
        uVar3 = uVar2;
      }
      uVar3 = (uVar2 + new_capacity) - uVar3;
      v->_size = uVar3;
      __nbytes = v;
      if (0x1c < uVar3) {
        __nbytes = *(prevector<28U,_unsigned_char,_unsigned_int,_int> **)&v->_union;
      }
      AutoFile::read(is->m_substream,uVar5 + (int)__nbytes,(void *)(ulong)uVar7,(size_t)__nbytes);
      uVar5 = new_capacity;
    } while (new_capacity < uVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Unserialize(Stream& is, prevector<N, T>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        // Limit size per read so bogus size value won't cause out of memory
        v.clear();
        unsigned int nSize = ReadCompactSize(is);
        unsigned int i = 0;
        while (i < nSize) {
            unsigned int blk = std::min(nSize - i, (unsigned int)(1 + 4999999 / sizeof(T)));
            v.resize_uninitialized(i + blk);
            is.read(AsWritableBytes(Span{&v[i], blk}));
            i += blk;
        }
    } else {
        Unserialize(is, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}